

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::SeparatedSyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }